

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_coin.cpp
# Opt level: O0

void __thiscall
cfdcapi_coin_CfCoinSelection_Asset1_Test::TestBody(cfdcapi_coin_CfCoinSelection_Asset1_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_type sVar5;
  ulong uVar6;
  char *in_R9;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  int64_t amount;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  uint32_t index_1;
  vector<int,_std::allocator<int>_> indexes;
  int32_t utxo_index;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  int64_t utxo_fee_amount;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  ByteData txid;
  Utxo *utxo;
  int32_t index;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  int64_t knapsack_min_change;
  double dust_fee_rate;
  double long_term_fee_rate;
  double effective_fee_rate;
  int64_t tx_fee_amount;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  void *coin_select_handle;
  anon_class_1_0_00000001 convert_to_byte;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  char *kDescriptor;
  undefined1 in_stack_00000c1f;
  bool *in_stack_fffffffffffff7b8;
  char *in_stack_fffffffffffff7c0;
  void **in_stack_fffffffffffff7c8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7dc;
  undefined8 in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e8;
  undefined4 in_stack_fffffffffffff7ec;
  void *in_stack_fffffffffffff7f0;
  char *in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  undefined7 in_stack_fffffffffffff818;
  undefined1 in_stack_fffffffffffff81f;
  uint8_t *in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff828;
  undefined4 in_stack_fffffffffffff82c;
  char *in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff848;
  int in_stack_fffffffffffff84c;
  undefined4 in_stack_fffffffffffff8e0;
  undefined4 uVar7;
  char *in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8f0;
  undefined4 uVar8;
  void *handle_00;
  char *in_stack_fffffffffffff968;
  void *in_stack_fffffffffffff970;
  undefined8 in_stack_fffffffffffff978;
  uint32_t uVar9;
  int in_stack_fffffffffffff980;
  char *in_stack_fffffffffffff988;
  AssertHelper local_618;
  Message local_610;
  undefined4 local_604;
  AssertionResult local_600;
  AssertHelper local_5f0;
  Message local_5e8;
  undefined4 local_5dc;
  AssertionResult local_5d8;
  AssertHelper local_5c8;
  Message local_5c0;
  undefined4 local_5b4;
  AssertionResult local_5b0;
  AssertHelper local_5a0;
  Message local_598;
  undefined4 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa74;
  double in_stack_fffffffffffffa78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa80;
  AssertHelper in_stack_fffffffffffffa88;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  uint32_t in_stack_fffffffffffffaa0;
  uint32_t in_stack_fffffffffffffaa4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffaa8;
  AssertHelper local_550;
  Message local_548;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  AssertionResult local_538;
  AssertHelper local_528;
  Message local_520;
  undefined4 local_514;
  AssertionResult local_510;
  AssertHelper local_500;
  Message local_4f8;
  undefined4 local_4ec;
  AssertionResult local_4e8;
  undefined8 local_4d8;
  AssertHelper local_4d0;
  Message local_4c8;
  undefined4 local_4bc;
  AssertionResult local_4b8;
  AssertHelper local_4a8;
  Message local_4a0;
  undefined4 local_494;
  AssertionResult local_490;
  AssertHelper local_480;
  Message local_478;
  undefined4 local_46c;
  AssertionResult local_468;
  AssertHelper local_458;
  Message local_450;
  undefined4 local_444;
  AssertionResult local_440;
  AssertHelper local_430;
  Message local_428;
  undefined4 local_41c;
  AssertionResult local_418;
  AssertHelper local_408;
  Message local_400;
  size_type local_3f8;
  undefined4 local_3ec;
  int64_t *in_stack_fffffffffffffc18;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc20;
  AssertHelper in_stack_fffffffffffffc28;
  Message local_3d0;
  undefined4 local_3c4;
  AssertionResult local_3c0;
  uint local_3ac;
  vector<int,_std::allocator<int>_> local_3a8;
  int local_38c;
  AssertHelper local_388;
  Message local_380;
  undefined4 local_374;
  AssertionResult local_370;
  AssertHelper local_360;
  Message local_358;
  undefined4 local_34c;
  AssertionResult local_348;
  undefined8 local_338;
  AssertHelper local_330;
  Message local_328;
  undefined4 local_31c;
  AssertionResult local_318;
  string local_308;
  AssertHelper local_2e8;
  Message local_2e0;
  undefined4 local_2d4;
  AssertionResult local_2d0;
  string local_2c0;
  AssertHelper local_2a0;
  Message local_298;
  undefined4 local_28c;
  AssertionResult local_288;
  string local_278;
  AssertHelper local_258;
  Message local_250;
  undefined4 local_244;
  AssertionResult local_240;
  ByteData local_230;
  string local_218;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1f8;
  ByteData256 local_1e0;
  Txid local_1c8;
  string local_1a8;
  ByteData local_188;
  reference local_170;
  int local_164;
  AssertHelper local_160;
  Message local_158;
  undefined8 local_150;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  undefined4 local_124;
  AssertionResult local_120;
  string local_110;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_c8;
  undefined8 local_b0;
  string local_a0;
  AssertHelper local_80;
  Message local_78;
  undefined1 local_69;
  AssertionResult local_68;
  AssertHelper local_58;
  Message local_50 [3];
  undefined4 local_34;
  AssertionResult local_30;
  int local_1c;
  void *local_18;
  char *local_10;
  
  local_10 = 
  "sh(wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x"
  ;
  local_18 = (void *)0x0;
  local_1c = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8))
  ;
  local_34 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
             (char *)in_stack_fffffffffffff7d0,(CfdErrorCode *)in_stack_fffffffffffff7c8,
             (int *)in_stack_fffffffffffff7c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x311cd9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x312,pcVar4);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message((Message *)0x311d3c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x311d91);
  local_69 = local_18 != (void *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,(type *)0x311dc5
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)&local_68,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x313,pcVar4);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::Message::~Message((Message *)0x311ec1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x311f3c);
  local_b0 = 0;
  CfdGetElementsUtxoListByC((bool)in_stack_00000c1f);
  local_d0 = 2000;
  local_d8 = 0xbff0000000000000;
  local_e0 = 0xbff0000000000000;
  local_e8 = 0xbff0000000000000;
  local_f0 = 0xffffffffffffffff;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_c8);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_110,&exp_dummy_asset_ca);
  std::__cxx11::string::c_str();
  local_1c = CfdInitializeCoinSelection
                       (in_stack_fffffffffffffaa8.ptr_,in_stack_fffffffffffffaa4,
                        in_stack_fffffffffffffaa0,
                        (char *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                        (int64_t)in_stack_fffffffffffffa90.ptr_,
                        (double)in_stack_fffffffffffffa88.data_,
                        (double)in_stack_fffffffffffffa80.ptr_,in_stack_fffffffffffffa78,
                        CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                        (void **)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  std::__cxx11::string::~string((string *)&local_110);
  local_124 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
             (char *)in_stack_fffffffffffff7d0,(CfdErrorCode *)in_stack_fffffffffffff7c8,
             (int *)in_stack_fffffffffffff7c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x312142);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x328,pcVar4);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message((Message *)0x3121a5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3121fa);
  local_150 = 0;
  testing::internal::CmpHelperNE<decltype(nullptr),void*>
            ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
             (char *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,
             (void **)in_stack_fffffffffffff7c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    in_stack_fffffffffffff988 =
         testing::AssertionResult::failure_message((AssertionResult *)0x3122a2);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x329,in_stack_fffffffffffff988);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message((Message *)0x312305);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31235d);
  if (local_1c == 0) {
    local_164 = 0;
    while( true ) {
      uVar9 = (uint32_t)((ulong)in_stack_fffffffffffff978 >> 0x20);
      iVar2 = local_164;
      sVar5 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_c8);
      if ((int)sVar5 <= iVar2) break;
      local_170 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[]
                            (&local_c8,(long)local_164);
      TestBody::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)
                 CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                 in_stack_fffffffffffff820,
                 CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
      in_stack_fffffffffffff970 = local_18;
      in_stack_fffffffffffff978 = local_b0;
      in_stack_fffffffffffff980 = local_164;
      cfd::core::ByteData::GetBytes(&local_1f8,&local_188);
      cfd::core::ByteData256::ByteData256(&local_1e0,&local_1f8);
      cfd::core::Txid::Txid(&local_1c8,&local_1e0);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_1a8,&local_1c8);
      std::__cxx11::string::c_str();
      in_stack_fffffffffffff968 = (char *)local_170->amount;
      TestBody::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)
                 CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),
                 in_stack_fffffffffffff820,
                 CONCAT17(in_stack_fffffffffffff81f,in_stack_fffffffffffff818));
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_218,&local_230);
      std::__cxx11::string::c_str();
      in_stack_fffffffffffff7c0 =
           "sh(wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x"
      ;
      local_1c = CfdAddCoinSelectionUtxo
                           (in_stack_fffffffffffff7f0,
                            (void *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                            (int32_t)((ulong)in_stack_fffffffffffff7e0 >> 0x20),
                            (char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
                            (uint32_t)((ulong)in_stack_fffffffffffff7d0 >> 0x20),
                            (int64_t)in_stack_fffffffffffff7c8,in_stack_fffffffffffff800,
                            (char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
      std::__cxx11::string::~string((string *)&local_218);
      cfd::core::ByteData::~ByteData((ByteData *)0x312568);
      std::__cxx11::string::~string((string *)&local_1a8);
      cfd::core::Txid::~Txid((Txid *)0x312582);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x31258f);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff7d0)
      ;
      local_244 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
                 (char *)in_stack_fffffffffffff7d0,(CfdErrorCode *)in_stack_fffffffffffff7c8,
                 (int *)in_stack_fffffffffffff7c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_240);
      if (!bVar1) {
        testing::Message::Message(&local_250);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x31273a);
        testing::internal::AssertHelper::AssertHelper
                  (&local_258,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x335,pcVar4);
        testing::internal::AssertHelper::operator=(&local_258,&local_250);
        testing::internal::AssertHelper::~AssertHelper(&local_258);
        testing::Message::~Message((Message *)0x31279d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3127f2);
      cfd::core::ByteData::~ByteData((ByteData *)0x3127ff);
      local_164 = local_164 + 1;
    }
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_278,&exp_dummy_asset_ca);
    std::__cxx11::string::c_str();
    local_1c = CfdAddCoinSelectionAmount
                         (in_stack_fffffffffffff988,
                          (void *)CONCAT44(iVar2,in_stack_fffffffffffff980),uVar9,
                          (int64_t)in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    std::__cxx11::string::~string((string *)&local_278);
    local_28c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
               (char *)in_stack_fffffffffffff7d0,(CfdErrorCode *)in_stack_fffffffffffff7c8,
               (int *)in_stack_fffffffffffff7c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_288);
    if (!bVar1) {
      testing::Message::Message(&local_298);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x312975);
      testing::internal::AssertHelper::AssertHelper
                (&local_2a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x33a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
      testing::internal::AssertHelper::~AssertHelper(&local_2a0);
      testing::Message::~Message((Message *)0x3129d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x312a30);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_2c0,&exp_dummy_asset_cb);
    std::__cxx11::string::c_str();
    local_1c = CfdAddCoinSelectionAmount
                         (in_stack_fffffffffffff988,
                          (void *)CONCAT44(iVar2,in_stack_fffffffffffff980),uVar9,
                          (int64_t)in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    std::__cxx11::string::~string((string *)&local_2c0);
    local_2d4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
               (char *)in_stack_fffffffffffff7d0,(CfdErrorCode *)in_stack_fffffffffffff7c8,
               (int *)in_stack_fffffffffffff7c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d0);
    if (!bVar1) {
      testing::Message::Message(&local_2e0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x312b86);
      testing::internal::AssertHelper::AssertHelper
                (&local_2e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x33d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
      testing::internal::AssertHelper::~AssertHelper(&local_2e8);
      testing::Message::~Message((Message *)0x312be9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x312c41);
    handle_00 = local_18;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_308,&exp_dummy_asset_cc);
    std::__cxx11::string::c_str();
    iVar2 = CfdAddCoinSelectionAmount
                      (in_stack_fffffffffffff988,(void *)CONCAT44(iVar2,in_stack_fffffffffffff980),
                       uVar9,(int64_t)in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    local_1c = iVar2;
    std::__cxx11::string::~string((string *)&local_308);
    local_31c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
               (char *)in_stack_fffffffffffff7d0,(CfdErrorCode *)in_stack_fffffffffffff7c8,
               (int *)in_stack_fffffffffffff7c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_318);
    uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8f0);
    if (!bVar1) {
      testing::Message::Message(&local_328);
      in_stack_fffffffffffff8e8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x312d97);
      testing::internal::AssertHelper::AssertHelper
                (&local_330,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x340,in_stack_fffffffffffff8e8);
      testing::internal::AssertHelper::operator=(&local_330,&local_328);
      testing::internal::AssertHelper::~AssertHelper(&local_330);
      testing::Message::~Message((Message *)0x312dfa);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x312e52);
    local_338 = 0;
    iVar3 = CfdFinalizeCoinSelection
                      (in_stack_fffffffffffffc28.data_,in_stack_fffffffffffffc20.ptr_,
                       in_stack_fffffffffffffc18);
    local_34c = 0;
    local_1c = iVar3;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
               (char *)in_stack_fffffffffffff7d0,(CfdErrorCode *)in_stack_fffffffffffff7c8,
               (int *)in_stack_fffffffffffff7c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_348);
    uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8e0);
    if (!bVar1) {
      testing::Message::Message(&local_358);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x312f39);
      testing::internal::AssertHelper::AssertHelper
                (&local_360,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x344,pcVar4);
      testing::internal::AssertHelper::operator=(&local_360,&local_358);
      testing::internal::AssertHelper::~AssertHelper(&local_360);
      testing::Message::~Message((Message *)0x312f9c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x312ff1);
    local_374 = 0x23f0;
    testing::internal::EqHelper<false>::Compare<int,long>
              ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
               (char *)in_stack_fffffffffffff7d0,(int *)in_stack_fffffffffffff7c8,
               (long *)in_stack_fffffffffffff7c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_370);
    if (!bVar1) {
      testing::Message::Message(&local_380);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x313098);
      testing::internal::AssertHelper::AssertHelper
                (&local_388,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x345,pcVar4);
      testing::internal::AssertHelper::operator=(&local_388,&local_380);
      testing::internal::AssertHelper::~AssertHelper(&local_388);
      testing::Message::~Message((Message *)0x3130fb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x313153);
    local_38c = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x31316b);
    local_3ac = 0;
    while( true ) {
      uVar6 = (ulong)local_3ac;
      sVar5 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_c8);
      uVar9 = (uint32_t)((ulong)in_stack_fffffffffffff8e8 >> 0x20);
      if (sVar5 <= uVar6) break;
      local_1c = CfdGetSelectedCoinIndex
                           (handle_00,(void *)CONCAT44(iVar2,uVar8),uVar9,
                            (int32_t *)CONCAT44(iVar3,uVar7));
      local_3c4 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
                 (char *)in_stack_fffffffffffff7d0,(CfdErrorCode *)in_stack_fffffffffffff7c8,
                 (int *)in_stack_fffffffffffff7c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c0);
      if (!bVar1) {
        testing::Message::Message(&local_3d0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3132a1);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffc28,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x34c,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffc28,&local_3d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc28);
        testing::Message::~Message((Message *)0x313304);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x313359);
      uVar9 = (uint32_t)((ulong)in_stack_fffffffffffff8e8 >> 0x20);
      if (local_38c == -1) break;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7d0,
                 (value_type_conflict2 *)in_stack_fffffffffffff7c8);
      local_3ac = local_3ac + 1;
    }
    local_3ec = 5;
    local_3f8 = std::vector<int,_std::allocator<int>_>::size(&local_3a8);
    testing::internal::EqHelper<false>::Compare<int,unsigned_long>
              ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
               (char *)in_stack_fffffffffffff7d0,(int *)in_stack_fffffffffffff7c8,
               (unsigned_long *)in_stack_fffffffffffff7c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffc18);
    if (!bVar1) {
      testing::Message::Message(&local_400);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x313450);
      testing::internal::AssertHelper::AssertHelper
                (&local_408,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x352,pcVar4);
      testing::internal::AssertHelper::operator=(&local_408,&local_400);
      testing::internal::AssertHelper::~AssertHelper(&local_408);
      testing::Message::~Message((Message *)0x3134b3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x31350b);
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_3a8);
    if (sVar5 == 5) {
      local_41c = 8;
      std::vector<int,_std::allocator<int>_>::operator[](&local_3a8,0);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
                 (char *)in_stack_fffffffffffff7d0,(int *)in_stack_fffffffffffff7c8,
                 (int *)in_stack_fffffffffffff7c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_418);
      if (!bVar1) {
        testing::Message::Message(&local_428);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3135d5);
        testing::internal::AssertHelper::AssertHelper
                  (&local_430,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x355,pcVar4);
        testing::internal::AssertHelper::operator=(&local_430,&local_428);
        testing::internal::AssertHelper::~AssertHelper(&local_430);
        testing::Message::~Message((Message *)0x313638);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x31368d);
      local_444 = 7;
      std::vector<int,_std::allocator<int>_>::operator[](&local_3a8,1);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
                 (char *)in_stack_fffffffffffff7d0,(int *)in_stack_fffffffffffff7c8,
                 (int *)in_stack_fffffffffffff7c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_440);
      if (!bVar1) {
        testing::Message::Message(&local_450);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x313741);
        testing::internal::AssertHelper::AssertHelper
                  (&local_458,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x356,pcVar4);
        testing::internal::AssertHelper::operator=(&local_458,&local_450);
        testing::internal::AssertHelper::~AssertHelper(&local_458);
        testing::Message::~Message((Message *)0x3137a4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3137f9);
      local_46c = 10;
      std::vector<int,_std::allocator<int>_>::operator[](&local_3a8,2);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
                 (char *)in_stack_fffffffffffff7d0,(int *)in_stack_fffffffffffff7c8,
                 (int *)in_stack_fffffffffffff7c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_468);
      if (!bVar1) {
        testing::Message::Message(&local_478);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3138ad);
        testing::internal::AssertHelper::AssertHelper
                  (&local_480,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x357,pcVar4);
        testing::internal::AssertHelper::operator=(&local_480,&local_478);
        testing::internal::AssertHelper::~AssertHelper(&local_480);
        testing::Message::~Message((Message *)0x313910);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x313965);
      local_494 = 1;
      std::vector<int,_std::allocator<int>_>::operator[](&local_3a8,3);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
                 (char *)in_stack_fffffffffffff7d0,(int *)in_stack_fffffffffffff7c8,
                 (int *)in_stack_fffffffffffff7c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_490);
      if (!bVar1) {
        testing::Message::Message(&local_4a0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x313a19);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x358,pcVar4);
        testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
        testing::internal::AssertHelper::~AssertHelper(&local_4a8);
        testing::Message::~Message((Message *)0x313a7c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x313ad1);
      local_4bc = 3;
      std::vector<int,_std::allocator<int>_>::operator[](&local_3a8,4);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
                 (char *)in_stack_fffffffffffff7d0,(int *)in_stack_fffffffffffff7c8,
                 (int *)in_stack_fffffffffffff7c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4b8);
      if (!bVar1) {
        testing::Message::Message(&local_4c8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x313b85);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                   ,0x359,pcVar4);
        testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
        testing::internal::AssertHelper::~AssertHelper(&local_4d0);
        testing::Message::~Message((Message *)0x313be8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x313c3d);
    }
    local_4d8 = 0;
    in_stack_fffffffffffff84c =
         CfdGetSelectedCoinAssetAmount
                   (handle_00,(void *)CONCAT44(iVar2,uVar8),uVar9,(int64_t *)CONCAT44(iVar3,uVar7));
    local_4ec = 0;
    local_1c = in_stack_fffffffffffff84c;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
               (char *)in_stack_fffffffffffff7d0,(CfdErrorCode *)in_stack_fffffffffffff7c8,
               (int *)in_stack_fffffffffffff7c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e8);
    in_stack_fffffffffffff848 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff848);
    if (!bVar1) {
      testing::Message::Message(&local_4f8);
      in_stack_fffffffffffff840 =
           testing::AssertionResult::failure_message((AssertionResult *)0x313d28);
      testing::internal::AssertHelper::AssertHelper
                (&local_500,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x36a,in_stack_fffffffffffff840);
      testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
      testing::internal::AssertHelper::~AssertHelper(&local_500);
      testing::Message::~Message((Message *)0x313d8b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x313de0);
    local_514 = 0x6fc23ac;
    testing::internal::EqHelper<false>::Compare<int,long>
              ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
               (char *)in_stack_fffffffffffff7d0,(int *)in_stack_fffffffffffff7c8,
               (long *)in_stack_fffffffffffff7c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_510);
    if (!bVar1) {
      testing::Message::Message(&local_520);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x313e87);
      testing::internal::AssertHelper::AssertHelper
                (&local_528,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x36b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_528,&local_520);
      testing::internal::AssertHelper::~AssertHelper(&local_528);
      testing::Message::~Message((Message *)0x313ee4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x313f3c);
    local_1c = CfdGetSelectedCoinAssetAmount
                         (handle_00,(void *)CONCAT44(iVar2,uVar8),uVar9,
                          (int64_t *)CONCAT44(iVar3,uVar7));
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
               (char *)in_stack_fffffffffffff7d0,(CfdErrorCode *)in_stack_fffffffffffff7c8,
               (int *)in_stack_fffffffffffff7c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_538);
    if (!bVar1) {
      testing::Message::Message(&local_548);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x314010);
      testing::internal::AssertHelper::AssertHelper
                (&local_550,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x36d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_550,&local_548);
      testing::internal::AssertHelper::~AssertHelper(&local_550);
      testing::Message::~Message((Message *)0x31406d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3140c2);
    testing::internal::EqHelper<false>::Compare<int,long>
              ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
               (char *)in_stack_fffffffffffff7d0,(int *)in_stack_fffffffffffff7c8,
               (long *)in_stack_fffffffffffff7c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffaa0);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffa90);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x314163);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffa88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x36e,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffa88,(Message *)&stack0xfffffffffffffa90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffa88);
      testing::Message::~Message((Message *)0x3141c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x314218);
    local_1c = CfdGetSelectedCoinAssetAmount
                         (handle_00,(void *)CONCAT44(iVar2,uVar8),uVar9,
                          (int64_t *)CONCAT44(iVar3,uVar7));
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
               (char *)in_stack_fffffffffffff7d0,(CfdErrorCode *)in_stack_fffffffffffff7c8,
               (int *)in_stack_fffffffffffff7c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffa78);
    if (!bVar1) {
      testing::Message::Message(&local_598);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3142ec);
      testing::internal::AssertHelper::AssertHelper
                (&local_5a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x370,pcVar4);
      testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
      testing::internal::AssertHelper::~AssertHelper(&local_5a0);
      testing::Message::~Message((Message *)0x314349);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x31439e);
    local_5b4 = 0x23e8eb8;
    testing::internal::EqHelper<false>::Compare<int,long>
              ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
               (char *)in_stack_fffffffffffff7d0,(int *)in_stack_fffffffffffff7c8,
               (long *)in_stack_fffffffffffff7c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5b0);
    if (!bVar1) {
      testing::Message::Message(&local_5c0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x31443f);
      testing::internal::AssertHelper::AssertHelper
                (&local_5c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0x371,pcVar4);
      testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
      testing::internal::AssertHelper::~AssertHelper(&local_5c8);
      testing::Message::~Message((Message *)0x31449c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3144f1);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7d0);
  }
  local_1c = CfdFreeCoinSelectionHandle
                       ((void *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                        in_stack_fffffffffffff840);
  local_5dc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
             (char *)in_stack_fffffffffffff7d0,(CfdErrorCode *)in_stack_fffffffffffff7c8,
             (int *)in_stack_fffffffffffff7c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5d8);
  if (!bVar1) {
    testing::Message::Message(&local_5e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3145d4);
    testing::internal::AssertHelper::AssertHelper
              (&local_5f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x374,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5f0,&local_5e8);
    testing::internal::AssertHelper::~AssertHelper(&local_5f0);
    testing::Message::~Message((Message *)0x314631);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x314689);
  local_1c = CfdFreeHandle(in_stack_fffffffffffff7c8);
  local_604 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(local_1c,in_stack_fffffffffffff7d8),(char *)in_stack_fffffffffffff7d0,
             (CfdErrorCode *)in_stack_fffffffffffff7c8,(int *)in_stack_fffffffffffff7c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_600);
  if (!bVar1) {
    testing::Message::Message(&local_610);
    in_stack_fffffffffffff7d0 =
         (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x314748);
    testing::internal::AssertHelper::AssertHelper
              (&local_618,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0x377,(char *)in_stack_fffffffffffff7d0);
    testing::internal::AssertHelper::operator=(&local_618,&local_610);
    testing::internal::AssertHelper::~AssertHelper(&local_618);
    testing::Message::~Message((Message *)0x3147a5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3147fa);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffff7d0);
  return;
}

Assistant:

TEST(cfdcapi_coin, CfCoinSelection_Asset1) {
  constexpr const char* kDescriptor = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x";
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  auto convert_to_byte = [](const uint8_t* byte_array, size_t size) -> ByteData {
    std::vector<uint8_t> bytes(size);
    memcpy(bytes.data(), byte_array, bytes.size());
    return ByteData(bytes);
  };

  void* coin_select_handle = nullptr;
  std::vector<Utxo> utxos = CfdGetElementsUtxoListByC(true);
  int64_t tx_fee_amount = 2000;
  double effective_fee_rate = -1;
  double long_term_fee_rate = -1;
  double dust_fee_rate = -1;
  int64_t knapsack_min_change = -1;

  ret = CfdInitializeCoinSelection(
    handle, static_cast<uint32_t>(utxos.size()), 3,
    exp_dummy_asset_ca.GetHex().c_str(), tx_fee_amount,
    effective_fee_rate, long_term_fee_rate, dust_fee_rate,
    knapsack_min_change, &coin_select_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_NE(nullptr, coin_select_handle);

  if (ret == kCfdSuccess) {
    for (int32_t index = 0; index < static_cast<int32_t>(utxos.size()); ++index) {
      const Utxo& utxo = utxos[index];
      ByteData txid = convert_to_byte(utxo.txid, sizeof(utxo.txid));
      ret = CfdAddCoinSelectionUtxo(
          handle, coin_select_handle, index,
          Txid(ByteData256(txid.GetBytes())).GetHex().c_str(), utxo.vout,
          utxo.amount,
          convert_to_byte(utxo.asset, sizeof(utxo.asset)).GetHex().c_str(),
          kDescriptor);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    ret = CfdAddCoinSelectionAmount(handle, coin_select_handle, 0, 115800000,
         exp_dummy_asset_ca.GetHex().c_str());
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdAddCoinSelectionAmount(handle, coin_select_handle, 1, 347180040,
        exp_dummy_asset_cb.GetHex().c_str());
    EXPECT_EQ(kCfdSuccess, ret);
    ret = CfdAddCoinSelectionAmount(handle, coin_select_handle, 2, 37654100,
        exp_dummy_asset_cc.GetHex().c_str());
    EXPECT_EQ(kCfdSuccess, ret);

    int64_t utxo_fee_amount = 0;
    ret = CfdFinalizeCoinSelection(handle, coin_select_handle, &utxo_fee_amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(9200, utxo_fee_amount);

    int32_t utxo_index = 0;
    std::vector<int32_t> indexes;
    for (uint32_t index = 0; index < utxos.size(); ++index) {
      ret = CfdGetSelectedCoinIndex(
          handle, coin_select_handle, index, &utxo_index);
      EXPECT_EQ(kCfdSuccess, ret);
      if (utxo_index == -1) {
        break;
      }
      indexes.push_back(utxo_index);
    }
    EXPECT_EQ(5, indexes.size());

    if (indexes.size() == 5) {
      EXPECT_EQ(8, indexes[0]);
      EXPECT_EQ(7, indexes[1]);
      EXPECT_EQ(10, indexes[2]);
      EXPECT_EQ(1, indexes[3]);
      EXPECT_EQ(3, indexes[4]);
      /*
      req:
            A,  115800000
            B,  347180050
            C,   37654200
      res:
        8:  B,  346430050
        7:  B,     750000
        10: C,   37654200
        1:  A,   78125000
        3:  A,   39062500
      */
    }

    int64_t amount = 0;
    ret = CfdGetSelectedCoinAssetAmount(handle, coin_select_handle, 0, &amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(117187500, amount);
    ret = CfdGetSelectedCoinAssetAmount(handle, coin_select_handle, 1, &amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(347180050, amount);
    ret = CfdGetSelectedCoinAssetAmount(handle, coin_select_handle, 2, &amount);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(37654200, amount);
  }
  ret = CfdFreeCoinSelectionHandle(handle, coin_select_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}